

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greedy-lineage.hxx
# Opt level: O2

void __thiscall
lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::removeChild
          (DynamicLineage<std::vector<double,_std::allocator<double>_>_> *this,size_t v)

{
  pointer puVar1;
  unsigned_long uVar2;
  Index IVar3;
  runtime_error *this_00;
  
  IVar3 = andres::Partition<unsigned_long>::find(&this->partition_,v);
  puVar1 = (this->children_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = puVar1[IVar3];
  if (uVar2 != 0) {
    puVar1[IVar3] = uVar2 - 1;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Has no children to remove!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void removeChild(size_t v)
    {
        auto rep = findRep(v);
        if (children_[rep] == 0) {
            throw std::runtime_error("Has no children to remove!");
        }
        --children_[rep];
    }